

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointConnection,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcProduct *in;
  
  in = (IfcProduct *)operator_new(0x158);
  *(undefined ***)&in[1].super_IfcObject.field_0x28 = &PTR__Object_007e4a70;
  *(undefined8 *)&in[1].super_IfcObject.field_0x30 = 0;
  *(char **)&in[1].super_IfcObject.field_0x38 = "IfcStructuralPointConnection";
  Assimp::IFC::Schema_2x3::IfcStructuralConnection::IfcStructuralConnection
            ((IfcStructuralConnection *)in,&PTR_construction_vtable_24__008307d0);
  *(undefined ***)&in->super_IfcObject = &PTR__IfcStructuralPointConnection_008306a0;
  *(undefined ***)&in[1].super_IfcObject.field_0x28 = &PTR__IfcStructuralPointConnection_008307b8;
  *(undefined ***)&(in->super_IfcObject).field_0x88 = &PTR__IfcStructuralPointConnection_008306c8;
  (in->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcStructuralPointConnection_008306f0;
  *(undefined ***)&(in->super_IfcObject).field_0xd0 = &PTR__IfcStructuralPointConnection_00830718;
  *(undefined ***)&in->field_0x100 = &PTR__IfcStructuralPointConnection_00830740;
  *(undefined ***)&in->field_0x110 = &PTR__IfcStructuralPointConnection_00830768;
  *(undefined ***)&in[1].super_IfcObject.field_0x18 = &PTR__IfcStructuralPointConnection_00830790;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProduct>(db,params,in);
  return (Object *)
         (&(in->super_IfcObject).field_0x0 + *(long *)(*(long *)&in->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }